

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_load.cpp
# Opt level: O0

void T_LoadScripts(MapData *map)

{
  int iVar1;
  int iVar2;
  int iVar3;
  bool bVar4;
  uint uVar5;
  FLineTrans *pFVar6;
  FLineTrans *pFVar7;
  FLineTrans t;
  bool HasScripts;
  FScriptLoader parser;
  MapData *map_local;
  
  T_Init();
  t.args[3]._3_1_ = FScriptLoader::ParseInfo((FScriptLoader *)(t.args + 4),map);
  if ((((gameinfo.gametype == GAME_Doom) || (gameinfo.gametype == GAME_Heretic)) &&
      (bVar4 = FString::IsEmpty(&(level.info)->Translator), bVar4)) &&
     (((level.maptype == MAPTYPE_DOOM &&
       (uVar5 = TArray<FLineTrans,_FLineTrans>::Size
                          (&SimpleLineTranslations.super_TArray<FLineTrans,_FLineTrans>),
       0x110 < uVar5)) &&
      (pFVar6 = TArray<FLineTrans,_FLineTrans>::operator[]
                          (&SimpleLineTranslations.super_TArray<FLineTrans,_FLineTrans>,
                           (long)(int)((uint)(t.args[3]._3_1_ & 1) * -2 + 0x110)),
      pFVar6->special == 0x9e)))) {
    pFVar6 = TArray<FLineTrans,_FLineTrans>::operator[]
                       (&SimpleLineTranslations.super_TArray<FLineTrans,_FLineTrans>,0x10e);
    iVar2 = pFVar6->special;
    iVar3 = pFVar6->flags;
    t.special = pFVar6->args[0];
    t.flags = pFVar6->args[1];
    t.args._0_8_ = *(undefined8 *)(pFVar6->args + 2);
    t.args[2] = pFVar6->args[4];
    pFVar6 = TArray<FLineTrans,_FLineTrans>::operator[]
                       (&SimpleLineTranslations.super_TArray<FLineTrans,_FLineTrans>,0x110);
    pFVar7 = TArray<FLineTrans,_FLineTrans>::operator[]
                       (&SimpleLineTranslations.super_TArray<FLineTrans,_FLineTrans>,0x10e);
    iVar1 = pFVar6->flags;
    pFVar7->special = pFVar6->special;
    pFVar7->flags = iVar1;
    *(undefined8 *)pFVar7->args = *(undefined8 *)pFVar6->args;
    *(undefined8 *)(pFVar7->args + 2) = *(undefined8 *)(pFVar6->args + 2);
    pFVar7->args[4] = pFVar6->args[4];
    pFVar6 = TArray<FLineTrans,_FLineTrans>::operator[]
                       (&SimpleLineTranslations.super_TArray<FLineTrans,_FLineTrans>,0x110);
    pFVar6->special = iVar2;
    pFVar6->flags = iVar3;
    pFVar6->args[0] = t.special;
    pFVar6->args[1] = t.flags;
    *(undefined8 *)(pFVar6->args + 2) = t.args._0_8_;
    pFVar6->args[4] = t.args[2];
  }
  return;
}

Assistant:

void T_LoadScripts(MapData *map)
{
	FScriptLoader parser;
	
	T_Init();

	bool HasScripts = parser.ParseInfo(map);

	// Hack for Legacy compatibility: Since 272 is normally an MBF sky transfer we have to patch it.
	// It could be done with an additional translator but that would be sub-optimal for the user.
	// To handle this the default translator defines the proper Legacy type at index 270.
	// This code then then swaps 270 and 272 - but only if this is either Doom or Heretic and 
	// the default translator is being used.
	// Custom translators will not be patched.
	if ((gameinfo.gametype == GAME_Doom || gameinfo.gametype == GAME_Heretic) && level.info->Translator.IsEmpty() &&
		level.maptype == MAPTYPE_DOOM && SimpleLineTranslations.Size() > 272 && SimpleLineTranslations[272 - 2*HasScripts].special == FS_Execute)
	{
		FLineTrans t = SimpleLineTranslations[270];
		SimpleLineTranslations[270] = SimpleLineTranslations[272];
		SimpleLineTranslations[272] = t;
	}
}